

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

int32_t __thiscall
icu_63::Calendar::handleGetExtendedYearFromWeekFields(Calendar *this,int32_t yearWoy,int32_t woy)

{
  byte bVar1;
  UCalendarDaysOfWeek UVar2;
  UCalendarDateFields UVar3;
  int32_t iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char cVar9;
  uint uVar10;
  uint uVar11;
  double dVar12;
  
  UVar3 = resolveFields(this,(UFieldResolutionTable *)kDatePrecedence);
  iVar4 = getLocalDOW(this);
  UVar2 = this->fFirstDayOfWeek;
  iVar5 = (*(this->super_UObject)._vptr_UObject[0x21])(this,yearWoy,0,0);
  uVar11 = yearWoy + 1;
  iVar6 = (*(this->super_UObject)._vptr_UObject[0x21])(this,(ulong)uVar11,0,0);
  dVar12 = uprv_fmod_63((double)(iVar5 + 1) + 1.0,7.0);
  cVar9 = '\x01';
  if ((char)(int)dVar12 < '\0') {
    cVar9 = '\b';
  }
  iVar8 = (byte)(cVar9 + (char)(int)dVar12) - UVar2;
  iVar7 = iVar8 + 7;
  if (-1 < iVar8) {
    iVar7 = iVar8;
  }
  uVar10 = yearWoy;
  if (UVar3 == UCAL_DATE) {
    if (((this->fFields[2] != 0) ||
        (iVar5 = (*(this->super_UObject)._vptr_UObject[0x14])(this,3), uVar10 = uVar11, woy < iVar5)
        ) && (uVar10 = yearWoy, woy == 1)) {
      uVar10 = yearWoy + -1 + (uint)(this->fFields[2] == 0);
    }
  }
  else if (UVar3 == UCAL_WEEK_OF_YEAR) {
    bVar1 = this->fMinimalDaysInFirstWeek;
    iVar8 = -iVar7;
    if (woy == 1) {
      uVar10 = yearWoy - (uint)(iVar4 < iVar7 && (int)(uint)bVar1 <= iVar8 + 7);
    }
    else {
      iVar7 = (*(this->super_UObject)._vptr_UObject[0x14])(this,3);
      if (iVar7 <= woy) {
        if ((int)(uint)bVar1 <= iVar8 + 7) {
          iVar8 = iVar8 + -7;
        }
        uVar10 = uVar11;
        if (iVar8 + woy * 7 + iVar4 + iVar5 + 1 < iVar6) {
          uVar10 = yearWoy;
        }
      }
    }
  }
  return uVar10;
}

Assistant:

int32_t Calendar::handleGetExtendedYearFromWeekFields(int32_t yearWoy, int32_t woy)
{
    // We have UCAL_YEAR_WOY and UCAL_WEEK_OF_YEAR - from those, determine
    // what year we fall in, so that other code can set it properly.
    // (code borrowed from computeWeekFields and handleComputeJulianDay)
    //return yearWoy;

    // First, we need a reliable DOW.
    UCalendarDateFields bestField = resolveFields(kDatePrecedence); // !! Note: if subclasses have a different table, they should override handleGetExtendedYearFromWeekFields

    // Now, a local DOW
    int32_t dowLocal = getLocalDOW(); // 0..6
    int32_t firstDayOfWeek = getFirstDayOfWeek(); // Localized fdw
    int32_t jan1Start = handleComputeMonthStart(yearWoy, 0, FALSE);
    int32_t nextJan1Start = handleComputeMonthStart(yearWoy+1, 0, FALSE); // next year's Jan1 start

    // At this point julianDay is the 0-based day BEFORE the first day of
    // January 1, year 1 of the given calendar.  If julianDay == 0, it
    // specifies (Jan. 1, 1) - 1, in whatever calendar we are using (Julian
    // or Gregorian). (or it is before the month we are in, if useMonth is True)

    // At this point we need to process the WEEK_OF_MONTH or
    // WEEK_OF_YEAR, which are similar, or the DAY_OF_WEEK_IN_MONTH.
    // First, perform initial shared computations.  These locate the
    // first week of the period.

    // Get the 0-based localized DOW of day one of the month or year.
    // Valid range 0..6.
    int32_t first = julianDayToDayOfWeek(jan1Start + 1) - firstDayOfWeek;
    if (first < 0) {
        first += 7;
    }

    //// (nextFirst was not used below)
    // int32_t nextFirst = julianDayToDayOfWeek(nextJan1Start + 1) - firstDayOfWeek;
    // if (nextFirst < 0) {
    //     nextFirst += 7;
    //}

    int32_t minDays = getMinimalDaysInFirstWeek();
    UBool jan1InPrevYear = FALSE;  // January 1st in the year of WOY is the 1st week?  (i.e. first week is < minimal )
    //UBool nextJan1InPrevYear = FALSE; // January 1st of Year of WOY + 1 is in the first week?

    if((7 - first) < minDays) {
        jan1InPrevYear = TRUE;
    }

    //   if((7 - nextFirst) < minDays) {
    //     nextJan1InPrevYear = TRUE;
    //   }

    switch(bestField) {
    case UCAL_WEEK_OF_YEAR:
        if(woy == 1) {
            if(jan1InPrevYear == TRUE) {
                // the first week of January is in the previous year
                // therefore WOY1 is always solidly within yearWoy
                return yearWoy;
            } else {
                // First WOY is split between two years
                if( dowLocal < first) { // we are prior to Jan 1
                    return yearWoy-1; // previous year
                } else {
                    return yearWoy; // in this year
                }
            }
        } else if(woy >= getLeastMaximum(bestField)) {
            // we _might_ be in the last week..
            int32_t jd =  // Calculate JD of our target day:
                jan1Start +  // JD of Jan 1
                (7-first) + //  days in the first week (Jan 1.. )
                (woy-1)*7 + // add the weeks of the year
                dowLocal;   // the local dow (0..6) of last week
            if(jan1InPrevYear==FALSE) {
                jd -= 7; // woy already includes Jan 1's week.
            }

            if( (jd+1) >= nextJan1Start ) {
                // we are in week 52 or 53 etc. - actual year is yearWoy+1
                return yearWoy+1;
            } else {
                // still in yearWoy;
                return yearWoy;
            }
        } else {
            // we're not possibly in the last week -must be ywoy
            return yearWoy;
        }

    case UCAL_DATE:
        if((internalGet(UCAL_MONTH)==0) &&
            (woy >= getLeastMaximum(UCAL_WEEK_OF_YEAR))) {
                return yearWoy+1; // month 0, late woy = in the next year
            } else if(woy==1) {
                //if(nextJan1InPrevYear) {
                if(internalGet(UCAL_MONTH)==0) {
                    return yearWoy;
                } else {
                    return yearWoy-1;
                }
                //}
            }

            //(internalGet(UCAL_DATE) <= (7-first)) /* && in minDow  */ ) {
            //within 1st week and in this month..
            //return yearWoy+1;
            return yearWoy;

    default: // assume the year is appropriate
        return yearWoy;
    }
}